

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTcpIpLink.cpp
# Opt level: O2

void __thiscall xe::TcpIpRecvThread::run(TcpIpRecvThread *this)

{
  deSocketResult dVar1;
  ulong uVar2;
  Error *this_00;
  deUint8 *data;
  pointer puVar3;
  ulong uVar4;
  ulong __new_size;
  MessageType messageType;
  size_t numRecv;
  size_t messageSize;
  
LAB_001287e4:
  do {
    uVar4 = this->m_curMsgPos;
    messageSize = 0;
    messageType = MESSAGETYPE_NONE;
    __new_size = 8;
    if (7 < uVar4) {
      xs::Message::parseHeader
                ((this->m_curMsgBuf).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,8,&messageType,&messageSize);
      uVar4 = this->m_curMsgPos;
      __new_size = messageSize;
      if (messageSize <= uVar4) {
        data = (this->m_curMsgBuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
               ._M_impl.super__Vector_impl_data._M_start + 8;
        if (uVar4 < 9) {
          data = (deUint8 *)0x0;
        }
        handleMessage(this,messageType,data,messageSize - 8);
        this->m_curMsgPos = 0;
        goto LAB_001287e4;
      }
    }
    numRecv = 0;
    puVar3 = (this->m_curMsgBuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar2 = uVar4;
    if ((ulong)((long)(this->m_curMsgBuf).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar3) < __new_size) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&this->m_curMsgBuf,__new_size);
      puVar3 = (this->m_curMsgBuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar2 = this->m_curMsgPos;
    }
    dVar1 = de::Socket::receive(this->m_socket,puVar3 + uVar2,__new_size - uVar4,&numRecv);
    switch(dVar1) {
    case DE_SOCKETRESULT_WOULD_BLOCK:
      deYield();
      break;
    case DE_SOCKETRESULT_CONNECTION_CLOSED:
      this_00 = (Error *)__cxa_allocate_exception(0x10);
      Error::Error(this_00,"Connection closed","",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/xeTcpIpLink.cpp"
                   ,0x143);
LAB_0012894f:
      __cxa_throw(this_00,&Error::typeinfo,std::runtime_error::~runtime_error);
    case DE_SOCKETRESULT_CONNECTION_TERMINATED:
      this_00 = (Error *)__cxa_allocate_exception(0x10);
      Error::Error(this_00,"Connection terminated","",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/xeTcpIpLink.cpp"
                   ,0x145);
      goto LAB_0012894f;
    case DE_SOCKETRESULT_ERROR:
      this_00 = (Error *)__cxa_allocate_exception(0x10);
      Error::Error(this_00,"Socket error","",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/xeTcpIpLink.cpp"
                   ,0x147);
      goto LAB_0012894f;
    default:
      this->m_curMsgPos = this->m_curMsgPos + numRecv;
    }
  } while( true );
}

Assistant:

void TcpIpRecvThread::run (void)
{
	try
	{
		for (;;)
		{
			bool				hasHeader		= m_curMsgPos >= xs::MESSAGE_HEADER_SIZE;
			bool				hasPayload		= false;
			size_t				messageSize		= 0;
			xs::MessageType		messageType		= (xs::MessageType)0;

			if (hasHeader)
			{
				xs::Message::parseHeader(&m_curMsgBuf[0], xs::MESSAGE_HEADER_SIZE, messageType, messageSize);
				hasPayload = m_curMsgPos >= messageSize;
			}

			if (hasPayload)
			{
				// Process message.
				handleMessage(messageType, m_curMsgPos > xs::MESSAGE_HEADER_SIZE ? &m_curMsgBuf[xs::MESSAGE_HEADER_SIZE] : DE_NULL, messageSize-xs::MESSAGE_HEADER_SIZE);
				m_curMsgPos = 0;
			}
			else
			{
				// Try to receive missing bytes.
				size_t				curSize			= hasHeader ? messageSize : (size_t)xs::MESSAGE_HEADER_SIZE;
				size_t				bytesToRecv		= curSize-m_curMsgPos;
				size_t				numRecv			= 0;
				deSocketResult		result			= DE_SOCKETRESULT_LAST;

				if (m_curMsgBuf.size() < curSize)
					m_curMsgBuf.resize(curSize);

				result = m_socket.receive(&m_curMsgBuf[m_curMsgPos], bytesToRecv, &numRecv);

				if (result == DE_SOCKETRESULT_CONNECTION_CLOSED)
					XE_FAIL("Connection closed");
				else if (result == DE_SOCKETRESULT_CONNECTION_TERMINATED)
					XE_FAIL("Connection terminated");
				else if (result == DE_SOCKETRESULT_ERROR)
					XE_FAIL("Socket error");
				else if (result == DE_SOCKETRESULT_WOULD_BLOCK)
				{
					// \note Socket should not be in non-blocking mode.
					DE_ASSERT(numRecv == 0);
					deYield();
				}
				else
				{
					DE_ASSERT(result == DE_SOCKETRESULT_SUCCESS);
					DE_ASSERT(numRecv <= bytesToRecv);
					m_curMsgPos += numRecv;
					// Continue receiving bytes / handle message in next iter.
				}
			}
		}
	}
	catch (const std::exception& e)
	{
		m_state.setState(COMMLINKSTATE_ERROR, e.what());
	}
}